

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::
FormatString<char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [54],
          IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *Args_1,char (*Args_2) [54],
          IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *Args_3,char (*Args_4) [117]
          )

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [54])this,
             (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)Args,
             (char (*) [54])Args_1,
             (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)Args_2,
             (char (*) [117])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}